

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall
level_tools::register_scene_object
          (level_tools *this,char *name,string *reference,fmatrix *xform,uint32_t file_version)

{
  uint32_t uVar1;
  _matrix<float> *this_00;
  fmatrix *pfVar2;
  xr_visual_object *this_01;
  string *psVar3;
  fvector3 *pfVar4;
  uint32_t *puVar5;
  float _x;
  float _y;
  float _z;
  xr_visual_object *local_50 [3];
  xr_visual_object *local_38;
  xr_visual_object *new_visual;
  fmatrix *pfStack_28;
  uint32_t file_version_local;
  fmatrix *xform_local;
  string *reference_local;
  char *name_local;
  level_tools *this_local;
  
  new_visual._4_4_ = file_version;
  pfStack_28 = xform;
  xform_local = (fmatrix *)reference;
  reference_local = (string *)name;
  name_local = (char *)this;
  this_01 = (xr_visual_object *)operator_new(0x98);
  xray_re::xr_visual_object::xr_visual_object(this_01,this->m_scene);
  local_38 = this_01;
  psVar3 = xray_re::xr_custom_object::co_name_abi_cxx11_((xr_custom_object *)this_01);
  make_object_ref(this,psVar3,(char *)reference_local);
  pfVar4 = xray_re::xr_custom_object::co_position(&local_38->super_xr_custom_object);
  xray_re::_vector3<float>::set<float>(pfVar4,&(pfStack_28->field_0).field_1.c);
  pfVar4 = xray_re::xr_custom_object::co_scale(&local_38->super_xr_custom_object);
  _x = xray_re::_vector3<float>::magnitude((_vector3<float> *)pfStack_28);
  _y = xray_re::_vector3<float>::magnitude(&(pfStack_28->field_0).field_1.j);
  _z = xray_re::_vector3<float>::magnitude(&(pfStack_28->field_0).field_1.k);
  xray_re::_vector3<float>::set(pfVar4,_x,_y,_z);
  this_00 = pfStack_28;
  pfVar4 = xray_re::xr_custom_object::co_rotation(&local_38->super_xr_custom_object);
  xray_re::_matrix<float>::get_xyz(this_00,pfVar4);
  uVar1 = new_visual._4_4_;
  puVar5 = xray_re::xr_visual_object::file_version(local_38);
  pfVar2 = xform_local;
  *puVar5 = uVar1;
  psVar3 = xray_re::xr_visual_object::reference_abi_cxx11_(local_38);
  std::__cxx11::string::operator=((string *)psVar3,(string *)pfVar2);
  local_50[0] = local_38;
  std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::push_back
            (this->m_scene_visuals,(value_type *)local_50);
  return;
}

Assistant:

void level_tools::register_scene_object(const char* name, const std::string& reference, const fmatrix& xform, uint32_t file_version)
{
	xr_visual_object* new_visual = new xr_visual_object(*m_scene);
	// name it just like LE does
	make_object_ref(new_visual->co_name(), name);
	new_visual->co_position().set(xform.c);
	new_visual->co_scale().set(xform.i.magnitude(),
			xform.j.magnitude(), xform.k.magnitude());
	xform.get_xyz(new_visual->co_rotation());
	new_visual->file_version() = file_version;
	new_visual->reference() = reference;
	m_scene_visuals->push_back(new_visual);
}